

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O0

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,shared_ptr<nigel::AstTerm> *cExpr,
          int priority)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  undefined4 in_register_0000000c;
  shared_ptr<nigel::AstTerm> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  bool bVar6;
  shared_ptr<nigel::AstReturning> sVar7;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  undefined1 local_78 [40];
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<nigel::AstExpr> clTerm;
  int priority_local;
  shared_ptr<nigel::AstTerm> *cExpr_local;
  shared_ptr<nigel::AstExpr> *currLVal_local;
  AST_Parser *this_local;
  
  __r = (shared_ptr<nigel::AstTerm> *)CONCAT44(in_register_0000000c,priority);
  clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_R8D;
  std::shared_ptr<nigel::AstExpr>::shared_ptr((shared_ptr<nigel::AstExpr> *)local_40,(nullptr_t)0x0)
  ;
  do {
    peVar2 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)cExpr);
    local_78[0x1b] = block >> 0x18;
    local_90[0x17] = 0;
    if (peVar2->type == term) {
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_50);
      local_78[0x1b] = 1;
      peVar3 = std::__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)(currLVal + 2),&peVar3->op);
      bVar6 = true;
      if (clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ <= *pmVar4) goto LAB_001e1e63;
    }
    else {
LAB_001e1e63:
      iVar1 = clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_;
      local_78._20_4_ = 0x2d;
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)(currLVal + 2),(key_type *)(local_78 + 0x14));
      bVar6 = false;
      if (iVar1 == *pmVar4) {
        std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   cExpr);
        AstExpr::as<nigel::AstTerm>((AstExpr *)local_78);
        local_90[0x17] = 1;
        peVar3 = std::__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_78);
        pmVar4 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                               *)(currLVal + 2),&peVar3->op);
        bVar6 = *pmVar4 ==
                clTerm.super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._4_4_;
      }
    }
    if ((local_90[0x17] & 1) != 0) {
      std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)local_78);
    }
    if ((local_78[0x1b] & 1) != block >> 0x18) {
      std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)local_50);
    }
    if (bVar6) {
      std::shared_ptr<nigel::AstExpr>::operator=
                ((shared_ptr<nigel::AstExpr> *)local_40,(shared_ptr<nigel::AstExpr> *)cExpr);
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_90);
      peVar3 = std::__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_90);
      std::shared_ptr<nigel::AstExpr>::operator=((shared_ptr<nigel::AstExpr> *)cExpr,&peVar3->rVal);
      std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)local_90);
    }
    else {
      peVar2 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)cExpr);
      if (peVar2->type != returnStat) {
        bVar6 = std::operator!=((shared_ptr<nigel::AstExpr> *)local_40,(nullptr_t)0x0);
        if (bVar6) {
          peVar2 = std::
                   __shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_40);
          if (peVar2->type == term) {
            std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_40);
            AstExpr::as<nigel::AstTerm>((AstExpr *)local_b0);
            peVar3 = std::
                     __shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nigel::AstTerm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_b0);
            std::shared_ptr<nigel::AstReturning>::operator=(&peVar3->rVal,__r);
            std::shared_ptr<nigel::AstTerm>::~shared_ptr((shared_ptr<nigel::AstTerm> *)local_b0);
          }
          else {
            peVar2 = std::
                     __shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
            if (peVar2->type == returnStat) {
              std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_40);
              AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_c0);
              peVar5 = std::
                       __shared_ptr_access<nigel::AstReturnStatement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::AstReturnStatement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_c0);
              std::shared_ptr<nigel::AstReturning>::operator=(&peVar5->expr,__r);
              std::shared_ptr<nigel::AstReturnStatement>::~shared_ptr
                        ((shared_ptr<nigel::AstReturnStatement> *)local_c0);
            }
          }
          std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)cExpr);
          AstExpr::as<nigel::AstReturning>((AstExpr *)this);
        }
        else {
          std::shared_ptr<nigel::AstExpr>::operator=(currLVal + 0xb,__r);
          std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)cExpr);
          AstExpr::as<nigel::AstReturning>((AstExpr *)this);
        }
        std::shared_ptr<nigel::AstExpr>::~shared_ptr((shared_ptr<nigel::AstExpr> *)local_40);
        sVar7.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = extraout_RDX._M_pi;
        sVar7.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<nigel::AstReturning>)
               sVar7.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
      }
      std::shared_ptr<nigel::AstExpr>::operator=
                ((shared_ptr<nigel::AstExpr> *)local_40,(shared_ptr<nigel::AstExpr> *)cExpr);
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstReturnStatement>((AstExpr *)local_a0);
      peVar5 = std::
               __shared_ptr_access<nigel::AstReturnStatement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::AstReturnStatement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a0);
      std::shared_ptr<nigel::AstExpr>::operator=((shared_ptr<nigel::AstExpr> *)cExpr,&peVar5->expr);
      std::shared_ptr<nigel::AstReturnStatement>::~shared_ptr
                ((shared_ptr<nigel::AstReturnStatement> *)local_a0);
    }
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstTerm> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstExpr> clTerm = nullptr;//Should be a term or a return statement
		while( true )
		{//Split all possible (unatomic) expressions
			if( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
				( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstTerm>()->rVal;
			}
			else if( currLVal->type == AstExpr::Type::returnStat )
			{
				clTerm = currLVal;
				currLVal = currLVal->as<AstReturnStatement>()->expr;
			}
			else break;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			if( clTerm->type == AstExpr::Type::term )
				clTerm->as<AstTerm>()->rVal = cExpr;
			else if( clTerm->type == AstExpr::Type::returnStat )
				clTerm->as<AstReturnStatement>()->expr = cExpr;
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}